

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MauProxy.cpp
# Opt level: O0

void __thiscall mau::ProxySession::postNextRead(ProxySession *this,uint8_t *readBuffer)

{
  mutable_buffers_1 *in_RSI;
  endpoint_type *in_RDI;
  mutable_buffers_1 mVar1;
  basic_endpoint<asio::ip::udp> *in_stack_ffffffffffffff98;
  basic_endpoint<asio::ip::udp> *in_stack_ffffffffffffffa0;
  void *in_stack_ffffffffffffffb0;
  
  asio::ip::basic_endpoint<asio::ip::udp>::basic_endpoint((basic_endpoint<asio::ip::udp> *)0x10dea2)
  ;
  asio::ip::basic_endpoint<asio::ip::udp>::operator=
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  std::
  unique_ptr<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
  ::operator->((unique_ptr<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
                *)0x10dec6);
  mVar1 = asio::buffer(in_stack_ffffffffffffffb0,(size_t)in_RDI);
  asio::basic_datagram_socket<asio::ip::udp,asio::datagram_socket_service<asio::ip::udp>>::
  async_receive_from<asio::mutable_buffers_1,mau::ProxySession::postNextRead(unsigned_char*)::__0>
            ((basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_> *)
             mVar1.super_mutable_buffer.data_,in_RSI,in_RDI,(anon_class_16_2_48e8bdf1 *)in_RDI);
  return;
}

Assistant:

void ProxySession::postNextRead(uint8_t* readBuffer)
{
    // Clear source address to allow us to check if it's filled later
    // during error handling
    SourceAddress = UDPAddress();

    // Dispatch asynchronous recvfrom()
    Socket->async_receive_from(
        asio::buffer(readBuffer + kQueueHeaderSize, ProxyConfig.MaxDatagramBytes),
        SourceAddress,
        [this, readBuffer](const asio::error_code& error, size_t bytes_transferred)
    {
        uint8_t* nextReadBuffer = readBuffer;

        // If there was an error reported:
        if (error)
        {
            std::string fromStr = "unrecognized";

            // If no source address was provided:
            if (SourceAddress.address().is_unspecified())
            {
                Logger.Warning("Socket broken based on recvfrom with no source address: ", error.message());
                LastResult = Mau_NetworkFailed;
                return; // Stop here
            }

            // Otherwise we assume it is due to ICMP message from a peer:

            if (SourceAddress == ClientAddress.Get())
            {
                Logger.Debug("recvfrom failed (ICMP from client): ", error.message());
                ClientAddress.Set(UDPAddress());
            }
            else if (SourceAddress == ServerAddress.Get())
            {
                Logger.Debug("recvfrom failed (ICMP from server): ", error.message());
                ClientAddress.Set(UDPAddress());
            }
            else {
                Logger.Debug("recvfrom failed (ICMP unrecognized source): ", error.message());
            }

            // Otherwise we assume it is due to ICMP message from a peer.
            // Fall-thru to continue reading datagrams
        }
        else if (bytes_transferred <= 0)
        {
            Logger.Warning("Socket closed");
            LastResult = Mau_NetworkFailed;
            return; // Stop here
        }
        else if (!Terminated)
        {
            MAU_DEBUG_ASSERT(bytes_transferred <= ProxyConfig.MaxDatagramBytes);

            QueueNode* queueNode = reinterpret_cast<QueueNode*>(readBuffer);
            queueNode->Bytes = static_cast<unsigned>(bytes_transferred);

            if (SourceAddress == ServerAddress.Get())
            {
                S2C.InsertQueueNode(queueNode);
                nextReadBuffer = ReadBufferAllocator.Allocate(kQueueHeaderSize + ProxyConfig.MaxDatagramBytes);
            }
            else
            {
                const UDPAddress clientAddress = ClientAddress.Get();

                if (clientAddress.address().is_unspecified())
                {
                    ClientAddress.Set(SourceAddress);
                    S2C.SetDeliveryAddress(SourceAddress);

                    C2S.InsertQueueNode(queueNode);
                    nextReadBuffer = ReadBufferAllocator.Allocate(kQueueHeaderSize + ProxyConfig.MaxDatagramBytes);

                    Logger.Info("Set client address to ", SourceAddress.address().to_string(), " : ", SourceAddress.port());
                }
                else if (SourceAddress == clientAddress)
                {
                    C2S.InsertQueueNode(queueNode);
                    nextReadBuffer = ReadBufferAllocator.Allocate(kQueueHeaderSize + ProxyConfig.MaxDatagramBytes);
                }
                else {
                    Logger.Warning("Ignored data from unrecognized source address ", SourceAddress.address().to_string(), " : ", SourceAddress.port());
                }
            }
        }

        // Post next read buffer
        postNextRead(nextReadBuffer);
    });
}